

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O2

bool ZXing::OneD::AddOn(PartialResult *res,PatternView begin,int digitCount)

{
  pointer pcVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  PartialResult *__str;
  int lgPattern;
  PartialResult *local_88;
  double local_80;
  PatternView local_78;
  int CHECK_DIGIT_ENCODINGS [10];
  
  local_88 = res;
  PatternView::subView(&local_78,&begin,0,digitCount * 6 + 1);
  bVar3 = PatternView::isValid(&local_78);
  if (!bVar3) {
    return false;
  }
  local_80 = IsPattern<false,3,4>
                       (&local_78,(FixedPattern<3,_4,_false> *)&EXT_START_PATTERN,0,0.0,0.0);
  if ((local_80 == 0.0) && (!NAN(local_80))) {
    return false;
  }
  if ((local_78._data + local_78._size == local_78._end + -1) ||
     (local_80 * 3.0 + -1.0 < (double)local_78._data[local_78._size])) {
    (local_88->end)._base = local_78._base;
    (local_88->end)._end = local_78._end;
    (local_88->end)._data = local_78._data;
    *(ulong *)&(local_88->end)._size = CONCAT44(local_78._12_4_,local_78._size);
    local_78._data = local_78._data + 3;
    local_78._size = 4;
    lgPattern = 0;
    (local_88->txt)._M_string_length = 0;
    *(local_88->txt)._M_dataplus._M_p = '\0';
    __str = local_88;
    iVar4 = 0;
    iVar7 = 0;
    if (0 < digitCount) {
      iVar4 = digitCount;
      iVar7 = 0;
    }
    for (; iVar4 != iVar7; iVar7 = iVar7 + 1) {
      bVar3 = DecodeDigit(&local_78,&__str->txt,&lgPattern);
      if (!bVar3) goto LAB_00175b64;
      if (local_78._data != (Iterator)0x0) {
        local_78._data = local_78._data + local_78._size;
      }
      if (iVar7 < digitCount + -1) {
        dVar2 = IsPattern<false,2,2>
                          (&local_78,(FixedPattern<2,_2,_false> *)&EXT_SEPARATOR_PATTERN,0,0.0,
                           local_80);
        if ((dVar2 == 0.0) && (!NAN(dVar2))) {
          return false;
        }
        __str = local_88;
        if (local_78._data != (Iterator)0x0) {
          local_78._data = local_78._data + 2;
        }
      }
    }
    if (digitCount == 2) {
      iVar4 = std::__cxx11::stoi(&__str->txt,(size_t *)0x0,10);
      if (iVar4 % 4 != lgPattern) {
        return false;
      }
    }
    else {
      CHECK_DIGIT_ENCODINGS[4] = 0xc;
      CHECK_DIGIT_ENCODINGS[5] = 6;
      CHECK_DIGIT_ENCODINGS[6] = 3;
      CHECK_DIGIT_ENCODINGS[7] = 10;
      CHECK_DIGIT_ENCODINGS[0] = 0x18;
      CHECK_DIGIT_ENCODINGS[1] = 0x14;
      CHECK_DIGIT_ENCODINGS[2] = 0x12;
      CHECK_DIGIT_ENCODINGS[3] = 0x11;
      CHECK_DIGIT_ENCODINGS[8] = 9;
      CHECK_DIGIT_ENCODINGS[9] = 5;
      uVar5 = (uint)(__str->txt)._M_string_length;
      pcVar1 = (__str->txt)._M_dataplus._M_p;
      iVar4 = 0;
      for (uVar6 = (ulong)uVar5; 1 < (int)uVar6; uVar6 = uVar6 - 2) {
        iVar4 = iVar4 + pcVar1[uVar6 - 2] + -0x30;
      }
      iVar4 = iVar4 * 3;
      for (uVar5 = uVar5 - 1; -1 < (int)uVar5; uVar5 = uVar5 - 2) {
        iVar4 = iVar4 + pcVar1[uVar5] + -0x30;
      }
      iVar7 = IndexOf<int[10],int>(&CHECK_DIGIT_ENCODINGS,&lgPattern);
      if ((iVar4 * 3) % 10 != iVar7) goto LAB_00175b64;
    }
    local_88->format = Any;
    bVar3 = true;
  }
  else {
LAB_00175b64:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool AddOn(PartialResult& res, PatternView begin, int digitCount)
{
	auto ext = begin.subView(0, 3 + digitCount * 4 + (digitCount - 1) * 2);
	CHECK(ext.isValid());
	auto moduleSize = IsPattern(ext, EXT_START_PATTERN);
	CHECK(moduleSize);

	CHECK(ext.isAtLastBar() || *ext.end() > QUIET_ZONE_ADDON * moduleSize - 1);

	res.end = ext;
	ext = ext.subView(EXT_START_PATTERN.size(), CHAR_LEN);
	int lgPattern = 0;
	res.txt.clear();

	for (int i = 0; i < digitCount; ++i) {
		CHECK(DecodeDigit(ext, res.txt, &lgPattern));
		ext.skipSymbol();
		if (i < digitCount - 1) {
			CHECK(IsPattern(ext, EXT_SEPARATOR_PATTERN, 0, 0, moduleSize));
			ext.skipPair();
		}
	}

	if (digitCount == 2) {
		CHECK(std::stoi(res.txt) % 4 == lgPattern);
	} else {
		constexpr int CHECK_DIGIT_ENCODINGS[] = {0x18, 0x14, 0x12, 0x11, 0x0C, 0x06, 0x03, 0x0A, 0x09, 0x05};
		CHECK(Ean5Checksum(res.txt) == IndexOf(CHECK_DIGIT_ENCODINGS, lgPattern));
	}
	res.format = BarcodeFormat::Any; // make sure res.format is valid, see below
	return true;
}